

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktImageQualifiersTests.cpp
# Opt level: O2

void __thiscall
vkt::image::anon_unknown_0::MemoryQualifierInstanceImage::prepareDescriptors
          (MemoryQualifierInstanceImage *this)

{
  Move<vk::Handle<(vk::HandleType)21>_> *this_00;
  Move<vk::Handle<(vk::HandleType)19>_> *this_01;
  Move<vk::Handle<(vk::HandleType)22>_> *this_02;
  VkAllocationCallbacks *pVVar1;
  VkDevice device;
  DeviceInterface *vk;
  DescriptorPoolBuilder *this_03;
  DescriptorSetLayoutBuilder *this_04;
  DescriptorSetUpdateBuilder *this_05;
  VkDescriptorImageInfo descriptorImageInfo;
  VkAllocationCallbacks *pVStack_a0;
  RefBase<vk::Handle<(vk::HandleType)19>_> local_98;
  DescriptorSetLayoutBuilder local_78;
  
  device = Context::getDevice((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context
                             );
  vk = Context::getDeviceInterface
                 ((this->super_MemoryQualifierInstanceBase).super_TestInstance.m_context);
  ::vk::DescriptorPoolBuilder::DescriptorPoolBuilder((DescriptorPoolBuilder *)&local_98);
  this_03 = ::vk::DescriptorPoolBuilder::addType
                      ((DescriptorPoolBuilder *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,1);
  ::vk::DescriptorPoolBuilder::build
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&descriptorImageInfo,this_03,vk,device,1,1);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descriptorImageInfo._16_8_;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVStack_a0;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorImageInfo.sampler.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorImageInfo.imageView.m_internal;
  descriptorImageInfo.sampler.m_internal = 0;
  descriptorImageInfo.imageView.m_internal = 0;
  descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  descriptorImageInfo._20_4_ = 0;
  this_00 = &(this->super_MemoryQualifierInstanceBase).m_descriptorPool;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)21>_>);
  (this->super_MemoryQualifierInstanceBase).m_descriptorPool.
  super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_MemoryQualifierInstanceBase).m_descriptorPool.
  super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)
       local_78.m_immutableSamplerInfos.
       super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)21>_>).m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_MemoryQualifierInstanceBase).m_descriptorPool.
  super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&descriptorImageInfo);
  std::_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_>::
  ~_Vector_base((_Vector_base<vk::VkDescriptorPoolSize,_std::allocator<vk::VkDescriptorPoolSize>_> *
                )&local_98);
  ::vk::DescriptorSetLayoutBuilder::DescriptorSetLayoutBuilder(&local_78);
  this_04 = ::vk::DescriptorSetLayoutBuilder::addSingleBinding
                      (&local_78,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,0x20);
  ::vk::DescriptorSetLayoutBuilder::build
            ((Move<vk::Handle<(vk::HandleType)19>_> *)&local_98,this_04,vk,device,0);
  pVVar1 = local_98.m_data.deleter.m_allocator;
  descriptorImageInfo._16_8_ = local_98.m_data.deleter.m_device;
  descriptorImageInfo.sampler.m_internal = local_98.m_data.object.m_internal;
  descriptorImageInfo.imageView.m_internal = (deUint64)local_98.m_data.deleter.m_deviceIface;
  local_98.m_data.object.m_internal._0_4_ = 0;
  local_98.m_data.object.m_internal._4_4_ = 0;
  local_98.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_98.m_data.deleter.m_device = (VkDevice)0x0;
  local_98.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  this_01 = &(this->super_MemoryQualifierInstanceBase).m_descriptorSetLayout;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
            (&this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>);
  (this->super_MemoryQualifierInstanceBase).m_descriptorSetLayout.
  super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
       (VkDevice)descriptorImageInfo._16_8_;
  (this->super_MemoryQualifierInstanceBase).m_descriptorSetLayout.
  super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator = pVVar1;
  (this_01->super_RefBase<vk::Handle<(vk::HandleType)19>_>).m_data.object.m_internal =
       descriptorImageInfo.sampler.m_internal;
  (this->super_MemoryQualifierInstanceBase).m_descriptorSetLayout.
  super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)descriptorImageInfo.imageView.m_internal;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase(&local_98);
  ::vk::DescriptorSetLayoutBuilder::~DescriptorSetLayoutBuilder(&local_78);
  makeDescriptorSet((Move<vk::Handle<(vk::HandleType)22>_> *)&descriptorImageInfo,vk,device,
                    (VkDescriptorPool)
                    (this->super_MemoryQualifierInstanceBase).m_descriptorPool.
                    super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal,
                    (VkDescriptorSetLayout)
                    (this->super_MemoryQualifierInstanceBase).m_descriptorSetLayout.
                    super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal);
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)descriptorImageInfo._16_8_;
  local_78.m_immutableSamplerInfos.
  super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)pVVar1;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)descriptorImageInfo.sampler.m_internal;
  local_78.m_bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)descriptorImageInfo.imageView.m_internal;
  descriptorImageInfo.sampler.m_internal = 0;
  descriptorImageInfo.imageView.m_internal = 0;
  descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  descriptorImageInfo._20_4_ = 0;
  this_02 = &(this->super_MemoryQualifierInstanceBase).m_descriptorSet;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
            (&this_02->super_RefBase<vk::Handle<(vk::HandleType)22>_>);
  (this->super_MemoryQualifierInstanceBase).m_descriptorSet.
  super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       (VkDevice)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->super_MemoryQualifierInstanceBase).m_descriptorSet.
  super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.m_internal =
       (deUint64)
       local_78.m_immutableSamplerInfos.
       super__Vector_base<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo,_std::allocator<vk::DescriptorSetLayoutBuilder::ImmutableSamplerInfo>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this_02->super_RefBase<vk::Handle<(vk::HandleType)22>_>).m_data.object.m_internal =
       (deUint64)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->super_MemoryQualifierInstanceBase).m_descriptorSet.
  super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)
       local_78.m_bindings.
       super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&descriptorImageInfo);
  descriptorImageInfo.imageView.m_internal =
       (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  descriptorImageInfo.sampler.m_internal = 0;
  descriptorImageInfo.imageLayout = VK_IMAGE_LAYOUT_GENERAL;
  ::vk::DescriptorSetUpdateBuilder::DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_78);
  local_98.m_data.object.m_internal._0_4_ = 0;
  local_98.m_data.object.m_internal._4_4_ = 0;
  this_05 = ::vk::DescriptorSetUpdateBuilder::writeSingle
                      ((DescriptorSetUpdateBuilder *)&local_78,
                       (VkDescriptorSet)
                       (this->super_MemoryQualifierInstanceBase).m_descriptorSet.
                       super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal,
                       (Location *)&local_98,VK_DESCRIPTOR_TYPE_STORAGE_IMAGE,&descriptorImageInfo);
  ::vk::DescriptorSetUpdateBuilder::update(this_05,vk,device);
  ::vk::DescriptorSetUpdateBuilder::~DescriptorSetUpdateBuilder
            ((DescriptorSetUpdateBuilder *)&local_78);
  return;
}

Assistant:

void MemoryQualifierInstanceImage::prepareDescriptors (void)
{
	const VkDevice			device			= m_context.getDevice();
	const DeviceInterface&	deviceInterface = m_context.getDeviceInterface();

	// Create descriptor pool
	m_descriptorPool =
		DescriptorPoolBuilder()
		.addType(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE)
		.build(deviceInterface, device, VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT, 1u);

	// Create descriptor set layout
	m_descriptorSetLayout =
		DescriptorSetLayoutBuilder()
		.addSingleBinding(VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, VK_SHADER_STAGE_COMPUTE_BIT)
		.build(deviceInterface, device);

	// Allocate descriptor set
	m_descriptorSet = makeDescriptorSet(deviceInterface, device, *m_descriptorPool, *m_descriptorSetLayout);

	// Set the bindings
	const VkDescriptorImageInfo descriptorImageInfo = makeDescriptorImageInfo(DE_NULL, *m_imageView, VK_IMAGE_LAYOUT_GENERAL);

	DescriptorSetUpdateBuilder()
		.writeSingle(*m_descriptorSet, DescriptorSetUpdateBuilder::Location::binding(0u), VK_DESCRIPTOR_TYPE_STORAGE_IMAGE, &descriptorImageInfo)
		.update(deviceInterface, device);
}